

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.h
# Opt level: O0

void * __thiscall
CPrsArrayList::realloc_mem(CPrsArrayList *this,void *p,size_t oldsiz,size_t newsiz)

{
  void *__dest;
  size_t in_RDX;
  CTcPrsMem *in_RSI;
  void *pnew;
  
  __dest = CTcPrsMem::alloc(in_RSI,in_RDX);
  memcpy(__dest,in_RSI,in_RDX);
  return __dest;
}

Assistant:

virtual void *realloc_mem(void *p, size_t oldsiz, size_t newsiz)
    {
        void *pnew;

        /* allocate a new block from the parser pool */
        pnew = G_prsmem->alloc(newsiz);

        /* copy from the old block to the new block */
        memcpy(pnew, p, oldsiz);

        /* return the new block */
        return pnew;
    }